

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

bool __thiscall Json::Value::CZString::operator==(CZString *this,CZString *other)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  allocator<char> local_29;
  string local_28;
  
  if (this->cstr_ == (char *)0x0) {
    bVar3 = (this->field_1).index_ == (other->field_1).index_;
  }
  else {
    uVar2 = (this->field_1).index_ >> 2;
    if (uVar2 == (other->field_1).index_ >> 2) {
      if (other->cstr_ == (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_28,"assert json failed",&local_29);
        throwLogicError(&local_28);
      }
      iVar1 = bcmp(this->cstr_,other->cstr_,(ulong)uVar2);
      bVar3 = iVar1 == 0;
    }
    else {
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool Value::CZString::operator==(const CZString& other) const {
  if (!cstr_) return index_ == other.index_;
  //return strcmp(cstr_, other.cstr_) == 0;
  // Assume both are strings.
  unsigned this_len = this->storage_.length_;
  unsigned other_len = other.storage_.length_;
  if (this_len != other_len) return false;
  JSON_ASSERT(this->cstr_ && other.cstr_);
  int comp = memcmp(this->cstr_, other.cstr_, this_len);
  return comp == 0;
}